

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O3

void KillComponent(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                   *components,string *str)

{
  mapped_type *ppCVar1;
  _Hash_node_base *p_Var2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *__range2;
  mapped_type pCVar3;
  Component *target;
  mapped_type local_30;
  
  ppCVar1 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)components,str);
  local_30 = *ppCVar1;
  if (local_30 == (mapped_type)0x0) goto LAB_0011ef98;
  p_Var2 = (components->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 == (_Hash_node_base *)0x0) {
LAB_0011ef83:
    pCVar3 = local_30;
    Component::~Component(local_30);
  }
  else {
    do {
      std::
      _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(p_Var2[5]._M_nxt + 8),&local_30);
      std::
      _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(p_Var2[5]._M_nxt + 0xf),&local_30);
      std::
      _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)(p_Var2[5]._M_nxt + 0x24));
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
    if (local_30 != (mapped_type)0x0) goto LAB_0011ef83;
    pCVar3 = (Component *)0x0;
  }
  operator_delete(pCVar3);
LAB_0011ef98:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&components->_M_h,str);
  return;
}

Assistant:

void KillComponent(std::unordered_map<std::string, Component *> &components, const std::string& str) {
  Component* target = components[str];
  if (target) {
    for (auto& c : components) {
      c.second->pubDeps.erase(target);
      c.second->privDeps.erase(target);
      c.second->circulars.clear();
    }
    delete target;
  }
  components.erase(str);
}